

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomimm(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  expr *peVar4;
  ull uVar5;
  expr **ppeVar6;
  
  if (ctx->reverse != 0) {
    pmVar3 = matchimm(ctx,(bitfield *)v,spos);
    return pmVar3;
  }
  peVar4 = (expr *)calloc(0x48,1);
  peVar4->type = EXPR_NUM;
  uVar5 = getbf((bitfield *)v,a,m,ctx);
  peVar4->num1 = uVar5;
  iVar1 = ctx->atomsmax;
  if (iVar1 <= ctx->atomsnum) {
    iVar2 = 0x10;
    if (iVar1 != 0) {
      iVar2 = iVar1 * 2;
    }
    ctx->atomsmax = iVar2;
    ppeVar6 = (expr **)realloc(ctx->atoms,(long)iVar2 << 3);
    ctx->atoms = ppeVar6;
  }
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = peVar4;
  return (matches *)0x0;
}

Assistant:

struct matches *atomimm APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}